

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

string * __thiscall
cmGeneratorExpressionEvaluationFile::GetOutputFileName
          (string *__return_storage_ptr__,cmGeneratorExpressionEvaluationFile *this,
          cmLocalGenerator *lg,cmGeneratorTarget *target,string *config,string *lang)

{
  bool bVar1;
  pointer this_00;
  string *psVar2;
  string local_90;
  string local_70;
  undefined1 local_39;
  string *local_38;
  string *lang_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  string *outputFileName;
  
  local_39 = 0;
  local_38 = lang;
  lang_local = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)lg;
  lg_local = (cmLocalGenerator *)this;
  this_local = (cmGeneratorExpressionEvaluationFile *)__return_storage_ptr__;
  this_00 = std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::operator->(&this->OutputFileExpr);
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,(cmLocalGenerator *)target_local,lang_local,
                      (cmGeneratorTarget *)config_local,(cmGeneratorExpressionDAGChecker *)0x0,
                      (cmGeneratorTarget *)0x0,local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  bVar1 = cmsys::SystemTools::FileIsFullPath(__return_storage_ptr__);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&local_70,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    FixRelativePath(&local_90,this,__return_storage_ptr__,PathForOutput,
                    (cmLocalGenerator *)target_local);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionEvaluationFile::GetOutputFileName(
  cmLocalGenerator* lg, cmGeneratorTarget* target, const std::string& config,
  const std::string& lang)
{
  std::string outputFileName =
    this->OutputFileExpr->Evaluate(lg, config, target, nullptr, nullptr, lang);

  if (cmSystemTools::FileIsFullPath(outputFileName)) {
    outputFileName = cmSystemTools::CollapseFullPath(outputFileName);
  } else {
    outputFileName = this->FixRelativePath(outputFileName, PathForOutput, lg);
  }

  return outputFileName;
}